

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O2

void __thiscall
slang::syntax::SyntaxRewriter<InterleavedRewriter>::~SyntaxRewriter
          (SyntaxRewriter<InterleavedRewriter> *this)

{
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector(&this->tempTrees);
  detail::ChangeCollection::~ChangeCollection(&this->commits);
  BumpAllocator::~BumpAllocator(&this->alloc);
  return;
}

Assistant:

SyntaxRewriter() : factory(alloc) {}